

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lfunc.c
# Opt level: O3

StkId luaF_close(lua_State *L,StkId level,TStatus status,int yy)

{
  StkId pSVar1;
  TValue *pTVar2;
  StkId pSVar3;
  StkId pSVar4;
  long lVar5;
  TValue *uv;
  TValue *io1;
  
  lVar5 = (long)level - (L->stack).offset;
  luaF_closeupval(L,level);
  pSVar3 = (L->tbclist).p;
  if (level <= pSVar3) {
    pSVar1 = (L->stack).p;
    do {
      for (pSVar4 = pSVar3 + -(ulong)(pSVar3->tbclist).delta;
          (pSVar1 < pSVar4 && ((pSVar4->tbclist).delta == 0)); pSVar4 = pSVar4 + -0xffff) {
      }
      (L->tbclist).p = pSVar4;
      if (status == '\x06') {
LAB_0010dc8e:
        pSVar1 = (StkId)0x0;
      }
      else {
        if (status == '\0') {
          (L->top).p = pSVar3 + 1;
          goto LAB_0010dc8e;
        }
        pSVar1 = pSVar3 + 1;
        luaD_seterrorobj(L,status,pSVar1);
      }
      pSVar4 = (L->top).p;
      pTVar2 = luaT_gettmbyobj(L,&pSVar3->val,TM_CLOSE);
      (pSVar4->val).value_ = pTVar2->value_;
      (pSVar4->val).tt_ = pTVar2->tt_;
      pSVar4[1].val.value_ = (pSVar3->val).value_;
      *(lu_byte *)((long)pSVar4 + 0x18) = (pSVar3->val).tt_;
      if (pSVar1 == (StkId)0x0) {
        pSVar3 = pSVar4 + 2;
      }
      else {
        pSVar3 = pSVar4 + 3;
        pSVar4[2].val.value_ = (pSVar1->val).value_;
        *(lu_byte *)((long)pSVar4 + 0x28) = (pSVar1->val).tt_;
      }
      (L->top).p = pSVar3;
      if (yy == 0) {
        luaD_callnoyield(L,pSVar4,0);
      }
      else {
        luaD_call(L,pSVar4,0);
      }
      pSVar1 = (L->stack).p;
      pSVar3 = (L->tbclist).p;
      level = (StkId)((long)pSVar1 + lVar5);
    } while (level <= pSVar3);
  }
  return level;
}

Assistant:

StkId luaF_close (lua_State *L, StkId level, TStatus status, int yy) {
  ptrdiff_t levelrel = savestack(L, level);
  luaF_closeupval(L, level);  /* first, close the upvalues */
  while (L->tbclist.p >= level) {  /* traverse tbc's down to that level */
    StkId tbc = L->tbclist.p;  /* get variable index */
    poptbclist(L);  /* remove it from list */
    prepcallclosemth(L, tbc, status, yy);  /* close variable */
    level = restorestack(L, levelrel);
  }
  return level;
}